

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,EnergyReport *aReport)

{
  long *plVar1;
  long *plVar2;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *aBytes;
  long *plVar3;
  long *local_68;
  long local_58;
  long lStack_50;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ToString_abi_cxx11_(&local_48,this,&aReport->mChannelMask);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
    local_68 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
  aBytes = extraout_RDX;
  if (local_68 != &local_58) {
    operator_delete(local_68);
    aBytes = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
    aBytes = extraout_RDX_01;
  }
  utils::Hex_abi_cxx11_(&local_48,(utils *)&(this->mContext).mDomAliases,aBytes);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x263822);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    plVar3 = &local_58;
  }
  else {
    local_58 = *plVar2;
    plVar3 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar3);
  if (plVar3 != &local_58) {
    operator_delete(plVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const EnergyReport &aReport)
{
    std::string ret;
    ret += ToString(aReport.mChannelMask) + "\n";
    ret += "energyList=" + utils::Hex(aReport.mEnergyList);
    return ret;
}